

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::GraphicsRobustAccessPass::Process(GraphicsRobustAccessPass *this)

{
  Status local_2c;
  PerModuleState PStack_18;
  Status result;
  GraphicsRobustAccessPass *local_10;
  GraphicsRobustAccessPass *this_local;
  
  local_10 = this;
  memset(&stack0xffffffffffffffe8,0,8);
  PerModuleState::PerModuleState(&stack0xffffffffffffffe8);
  *(PerModuleState *)&(this->super_Pass).field_0x34 = PStack_18;
  ProcessCurrentModule(this);
  if (((this->super_Pass).field_0x35 & 1) == 0) {
    local_2c = SuccessWithoutChange;
    if (((this->super_Pass).field_0x34 & 1) != 0) {
      local_2c = SuccessWithChange;
    }
  }
  else {
    local_2c = Failure;
  }
  return local_2c;
}

Assistant:

Pass::Status GraphicsRobustAccessPass::Process() {
  module_status_ = PerModuleState();

  ProcessCurrentModule();

  auto result = module_status_.failed
                    ? Status::Failure
                    : (module_status_.modified ? Status::SuccessWithChange
                                               : Status::SuccessWithoutChange);

  return result;
}